

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxRegister.cpp
# Opt level: O3

void __thiscall
amrex::FluxRegister::CrseAdd
          (FluxRegister *this,MultiFab *mflx,int dir,int srccomp,int destcomp,int numcomp,Real mult,
          Geometry *geom)

{
  MFInfo local_1d8;
  MultiFab area;
  
  local_1d8.alloc = true;
  local_1d8._1_7_ = 0;
  local_1d8.arena = (Arena *)0x0;
  local_1d8.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MultiFab::MultiFab(&area,&(mflx->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
                     &(mflx->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,1,
                     0,&local_1d8,
                     (mflx->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                     super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                     _M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d8.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  local_1d8.alloc = false;
  local_1d8._1_7_ = 0;
  local_1d8.arena = (Arena *)((ulong)local_1d8.arena & 0xffffffff00000000);
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&area.super_FabArray<amrex::FArrayBox>,1.0,0,1,(IntVect *)&local_1d8);
  CrseAdd(this,mflx,&area,dir,srccomp,destcomp,numcomp,mult,geom);
  MultiFab::~MultiFab(&area);
  return;
}

Assistant:

void
FluxRegister::CrseAdd (const MultiFab& mflx,
                       int             dir,
                       int             srccomp,
                       int             destcomp,
                       int             numcomp,
                       Real            mult,
                       const Geometry& geom)
{
    BL_ASSERT(srccomp >= 0 && srccomp+numcomp <= mflx.nComp());
    BL_ASSERT(destcomp >= 0 && destcomp+numcomp <= ncomp);

    MultiFab area(mflx.boxArray(), mflx.DistributionMap(), 1, 0,
                  MFInfo(), mflx.Factory());

    area.setVal(1, 0, 1, 0);

    CrseAdd(mflx,area,dir,srccomp,destcomp,numcomp,mult,geom);
}